

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O3

int32_t __thiscall
icu_63::ThaiBreakEngine::divideUpDictionaryRange
          (ThaiBreakEngine *this,UText *text,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  bool bVar1;
  ThaiBreakEngine *pTVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  UChar32 c;
  int iVar7;
  UChar32 UVar8;
  int64_t iVar9;
  long lVar10;
  int64_t iVar11;
  uint uVar12;
  int iVar13;
  long index;
  int iVar14;
  int iVar15;
  UnicodeSet *this_00;
  int32_t iVar16;
  ulong uVar17;
  UErrorCode status;
  PossibleWord words [3];
  UErrorCode local_2ac;
  int64_t local_2a8;
  ThaiBreakEngine *local_2a0;
  UVector32 *local_298;
  UnicodeSet *local_290;
  ulong local_288;
  UnicodeSet *local_280;
  PossibleWord *local_278;
  ulong local_270;
  UnicodeSet *local_268 [2];
  PossibleWord aPStack_258 [3];
  
  index = (long)rangeStart;
  utext_setNativeIndex_63(text,index);
  utext_moveIndex32_63(text,4);
  iVar9 = utext_getNativeIndex_63(text);
  iVar16 = 0;
  if (iVar9 < rangeEnd) {
    utext_setNativeIndex_63(text,index);
    local_2ac = U_ZERO_ERROR;
    lVar10 = 0x10;
    do {
      *(undefined8 *)((long)local_268 + lVar10) = 0;
      *(undefined8 *)((long)aPStack_258[0].cuLengths + lVar10 + -0x1c) = 0xffffffff;
      *(undefined4 *)((long)aPStack_258[0].cuLengths + lVar10 + -0x14) = 0;
      lVar10 = lVar10 + 0xb4;
    } while (lVar10 != 0x22c);
    utext_setNativeIndex_63(text,index);
    uVar17 = 0;
    if (local_2ac < U_ILLEGAL_ARGUMENT_ERROR) {
      local_268[1] = &this->fEndWordSet;
      local_268[0] = &this->fBeginWordSet;
      local_280 = &this->fMarkSet;
      local_290 = &this->fSuffixSet;
      uVar17 = 0;
      local_2a0 = this;
      local_298 = foundBreaks;
      do {
        pTVar2 = local_2a0;
        local_2a8 = utext_getNativeIndex_63(text);
        if (rangeEnd <= (int)local_2a8) break;
        iVar14 = (int)uVar17;
        uVar12 = iVar14 + (int)(uVar17 / 3) * -3;
        iVar16 = PossibleWord::candidates(aPStack_258 + uVar12,text,pTVar2->fDictionary,rangeEnd);
        if (iVar16 == 1) {
LAB_002feae5:
          utext_setNativeIndex_63
                    (text,(long)aPStack_258[uVar12].cuLengths[aPStack_258[uVar12].mark] +
                          (long)aPStack_258[uVar12].offset);
          iVar16 = aPStack_258[uVar12].cuLengths[aPStack_258[uVar12].mark];
          uVar17 = (ulong)(iVar14 + 1);
          bVar1 = aPStack_258[uVar12].cpLengths[aPStack_258[uVar12].mark] < 3;
        }
        else {
          if (1 < iVar16) {
            iVar9 = utext_getNativeIndex_63(text);
            if ((int)iVar9 < rangeEnd) {
              uVar4 = ((iVar14 + 1U) / 3) * -3 + iVar14 + 1;
              do {
                iVar16 = PossibleWord::candidates
                                   (aPStack_258 + uVar4,text,pTVar2->fDictionary,rangeEnd);
                if (0 < iVar16) {
                  aPStack_258[uVar12].mark = aPStack_258[uVar12].current;
                  iVar9 = utext_getNativeIndex_63(text);
                  if (rangeEnd <= (int)iVar9) break;
                  while( true ) {
                    iVar16 = PossibleWord::candidates
                                       (aPStack_258 + (((iVar14 + 2U) / 3) * -3 + iVar14 + 2),text,
                                        pTVar2->fDictionary,rangeEnd);
                    if (iVar16 != 0) {
                      aPStack_258[uVar12].mark = aPStack_258[uVar12].current;
                      goto LAB_002feae5;
                    }
                    if (aPStack_258[uVar4].current < 1) break;
                    iVar13 = aPStack_258[uVar4].offset;
                    uVar5 = aPStack_258[uVar4].current - 1;
                    aPStack_258[uVar4].current = uVar5;
                    utext_setNativeIndex_63
                              (text,(long)aPStack_258[uVar4].cuLengths[uVar5] + (long)iVar13);
                  }
                }
                if (aPStack_258[uVar12].current < 1) break;
                iVar13 = aPStack_258[uVar12].offset;
                uVar5 = aPStack_258[uVar12].current - 1;
                aPStack_258[uVar12].current = uVar5;
                utext_setNativeIndex_63
                          (text,(long)aPStack_258[uVar12].cuLengths[uVar5] + (long)iVar13);
              } while( true );
            }
            goto LAB_002feae5;
          }
          bVar1 = true;
          iVar16 = 0;
        }
        iVar9 = utext_getNativeIndex_63(text);
        this_00 = local_280;
        if ((bVar1) && ((int)iVar9 < rangeEnd)) {
          uVar12 = (int)uVar17 + (int)(uVar17 / 3) * -3;
          iVar6 = PossibleWord::candidates
                            (aPStack_258 + uVar12,text,local_2a0->fDictionary,rangeEnd);
          if ((iVar6 < 1) && ((iVar16 == 0 || (aPStack_258[uVar12].prefix < 3)))) {
            uVar12 = (int)local_2a8 + iVar16;
            local_288 = uVar17;
            iVar9 = utext_getNativeIndex_63(text);
            UVar8 = utext_next32_63(text);
            iVar11 = utext_getNativeIndex_63(text);
            iVar13 = (int)iVar11 - (int)iVar9;
            iVar14 = rangeEnd - (iVar13 + uVar12);
            local_270 = (ulong)uVar12;
            if (0 < iVar14) {
              local_278 = aPStack_258 + ((int)local_288 + 1U) % 3;
              do {
                c = utext_current32_63(text);
                UVar3 = UnicodeSet::contains(local_268[1],UVar8);
                if ((UVar3 != '\0') && (UVar3 = UnicodeSet::contains(local_268[0],c), UVar3 != '\0')
                   ) {
                  iVar6 = PossibleWord::candidates(local_278,text,local_2a0->fDictionary,rangeEnd);
                  utext_setNativeIndex_63(text,(long)((int)local_270 + iVar13));
                  if (0 < iVar6) break;
                }
                iVar9 = utext_getNativeIndex_63(text);
                UVar8 = utext_next32_63(text);
                iVar11 = utext_getNativeIndex_63(text);
                iVar7 = (int)iVar11 - (int)iVar9;
                iVar13 = iVar13 + iVar7;
                iVar15 = iVar14 - iVar7;
                bVar1 = iVar7 <= iVar14;
                iVar14 = iVar15;
              } while (iVar15 != 0 && bVar1);
            }
            uVar17 = (ulong)((int)local_288 + (uint)(iVar16 < 1));
            iVar16 = iVar13 + iVar16;
            this_00 = local_280;
          }
          else {
            utext_setNativeIndex_63(text,(long)((int)local_2a8 + iVar16));
          }
        }
        while( true ) {
          iVar9 = utext_getNativeIndex_63(text);
          if (rangeEnd <= (int)iVar9) break;
          UVar8 = utext_current32_63(text);
          UVar3 = UnicodeSet::contains(this_00,UVar8);
          if (UVar3 == '\0') break;
          utext_next32_63(text);
          iVar11 = utext_getNativeIndex_63(text);
          iVar16 = (iVar16 - (int)iVar9) + (int)iVar11;
        }
        iVar9 = utext_getNativeIndex_63(text);
        if (((int)iVar9 < rangeEnd) && (0 < iVar16)) {
          iVar6 = PossibleWord::candidates
                            (aPStack_258 + (uint)((int)uVar17 + (int)(uVar17 / 3) * -3),text,
                             local_2a0->fDictionary,rangeEnd);
          if (iVar6 < 1) {
            UVar8 = utext_current32_63(text);
            UVar3 = UnicodeSet::contains(local_290,UVar8);
            if (UVar3 != '\0') {
              if (UVar8 != 0xe2f) {
LAB_002fef08:
                if (UVar8 == 0xe46) {
                  UVar8 = utext_previous32_63(text);
                  utext_next32_63(text);
                  if (UVar8 != 0xe46) {
                    iVar9 = utext_getNativeIndex_63(text);
                    utext_next32_63(text);
                    iVar11 = utext_getNativeIndex_63(text);
                    iVar16 = (iVar16 - (int)iVar9) + (int)iVar11;
                  }
                }
                goto LAB_002fef4b;
              }
              UVar8 = utext_previous32_63(text);
              UVar3 = UnicodeSet::contains(local_290,UVar8);
              utext_next32_63(text);
              if (UVar3 == '\0') {
                iVar9 = utext_getNativeIndex_63(text);
                utext_next32_63(text);
                iVar11 = utext_getNativeIndex_63(text);
                UVar8 = utext_current32_63(text);
                iVar16 = (iVar16 - (int)iVar9) + (int)iVar11;
                goto LAB_002fef08;
              }
              goto LAB_002fef55;
            }
          }
          utext_setNativeIndex_63(text,(long)((int)local_2a8 + iVar16));
LAB_002fef55:
          foundBreaks = local_298;
          iVar14 = local_298->count;
          if ((iVar14 < -1) || (local_298->capacity <= iVar14)) {
            UVar3 = UVector32::expandCapacity(local_298,iVar14 + 1,&local_2ac);
            if (UVar3 == '\0') goto LAB_002fef8b;
            iVar14 = foundBreaks->count;
          }
          foundBreaks->elements[iVar14] = iVar16 + (int)local_2a8;
          foundBreaks->count = foundBreaks->count + 1;
        }
        else {
LAB_002fef4b:
          foundBreaks = local_298;
          if (0 < iVar16) goto LAB_002fef55;
        }
LAB_002fef8b:
      } while (local_2ac < U_ILLEGAL_ARGUMENT_ERROR);
    }
    iVar13 = (int)uVar17;
    iVar14 = foundBreaks->count;
    if ((long)iVar14 < 1) {
      if (0 < rangeEnd) {
        return iVar13;
      }
    }
    else {
      if (foundBreaks->elements[(long)iVar14 + -1] < rangeEnd) {
        return iVar13;
      }
      foundBreaks->count = iVar14 + -1;
    }
    iVar16 = iVar13 + -1;
  }
  return iVar16;
}

Assistant:

int32_t
ThaiBreakEngine::divideUpDictionaryRange( UText *text,
                                                int32_t rangeStart,
                                                int32_t rangeEnd,
                                                UVector32 &foundBreaks ) const {
    utext_setNativeIndex(text, rangeStart);
    utext_moveIndex32(text, THAI_MIN_WORD_SPAN);
    if (utext_getNativeIndex(text) >= rangeEnd) {
        return 0;       // Not enough characters for two words
    }
    utext_setNativeIndex(text, rangeStart);


    uint32_t wordsFound = 0;
    int32_t cpWordLength = 0;    // Word Length in Code Points.
    int32_t cuWordLength = 0;    // Word length in code units (UText native indexing)
    int32_t current;
    UErrorCode status = U_ZERO_ERROR;
    PossibleWord words[THAI_LOOKAHEAD];
    
    utext_setNativeIndex(text, rangeStart);
    
    while (U_SUCCESS(status) && (current = (int32_t)utext_getNativeIndex(text)) < rangeEnd) {
        cpWordLength = 0;
        cuWordLength = 0;

        // Look for candidate words at the current position
        int32_t candidates = words[wordsFound%THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
        
        // If we found exactly one, use that
        if (candidates == 1) {
            cuWordLength = words[wordsFound % THAI_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % THAI_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        // If there was more than one, see which one can take us forward the most words
        else if (candidates > 1) {
            // If we're already at the end of the range, we're done
            if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                goto foundBest;
            }
            do {
                int32_t wordsMatched = 1;
                if (words[(wordsFound + 1) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) > 0) {
                    if (wordsMatched < 2) {
                        // Followed by another dictionary word; mark first word as a good candidate
                        words[wordsFound%THAI_LOOKAHEAD].markCurrent();
                        wordsMatched = 2;
                    }
                    
                    // If we're already at the end of the range, we're done
                    if ((int32_t)utext_getNativeIndex(text) >= rangeEnd) {
                        goto foundBest;
                    }
                    
                    // See if any of the possible second words is followed by a third word
                    do {
                        // If we find a third word, stop right away
                        if (words[(wordsFound + 2) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd)) {
                            words[wordsFound % THAI_LOOKAHEAD].markCurrent();
                            goto foundBest;
                        }
                    }
                    while (words[(wordsFound + 1) % THAI_LOOKAHEAD].backUp(text));
                }
            }
            while (words[wordsFound % THAI_LOOKAHEAD].backUp(text));
foundBest:
            // Set UText position to after the accepted word.
            cuWordLength = words[wordsFound % THAI_LOOKAHEAD].acceptMarked(text);
            cpWordLength = words[wordsFound % THAI_LOOKAHEAD].markedCPLength();
            wordsFound += 1;
        }
        
        // We come here after having either found a word or not. We look ahead to the
        // next word. If it's not a dictionary word, we will combine it with the word we
        // just found (if there is one), but only if the preceding word does not exceed
        // the threshold.
        // The text iterator should now be positioned at the end of the word we found.
        
        UChar32 uc = 0;
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd &&  cpWordLength < THAI_ROOT_COMBINE_THRESHOLD) {
            // if it is a dictionary word, do nothing. If it isn't, then if there is
            // no preceding word, or the non-word shares less than the minimum threshold
            // of characters with a dictionary word, then scan to resynchronize
            if (words[wordsFound % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                  && (cuWordLength == 0
                      || words[wordsFound%THAI_LOOKAHEAD].longestPrefix() < THAI_PREFIX_COMBINE_THRESHOLD)) {
                // Look for a plausible word boundary
                int32_t remaining = rangeEnd - (current+cuWordLength);
                UChar32 pc;
                int32_t chars = 0;
                for (;;) {
                    int32_t pcIndex = (int32_t)utext_getNativeIndex(text);
                    pc = utext_next32(text);
                    int32_t pcSize = (int32_t)utext_getNativeIndex(text) - pcIndex;
                    chars += pcSize;
                    remaining -= pcSize;
                    if (remaining <= 0) {
                        break;
                    }
                    uc = utext_current32(text);
                    if (fEndWordSet.contains(pc) && fBeginWordSet.contains(uc)) {
                        // Maybe. See if it's in the dictionary.
                        // NOTE: In the original Apple code, checked that the next
                        // two characters after uc were not 0x0E4C THANTHAKHAT before
                        // checking the dictionary. That is just a performance filter,
                        // but it's not clear it's faster than checking the trie.
                        int32_t num_candidates = words[(wordsFound + 1) % THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd);
                        utext_setNativeIndex(text, current + cuWordLength + chars);
                        if (num_candidates > 0) {
                            break;
                        }
                    }
                }
                
                // Bump the word count if there wasn't already one
                if (cuWordLength <= 0) {
                    wordsFound += 1;
                }
                
                // Update the length with the passed-over characters
                cuWordLength += chars;
            }
            else {
                // Back up to where we were for next iteration
                utext_setNativeIndex(text, current+cuWordLength);
            }
        }
        
        // Never stop before a combining mark.
        int32_t currPos;
        while ((currPos = (int32_t)utext_getNativeIndex(text)) < rangeEnd && fMarkSet.contains(utext_current32(text))) {
            utext_next32(text);
            cuWordLength += (int32_t)utext_getNativeIndex(text) - currPos;
        }
        
        // Look ahead for possible suffixes if a dictionary word does not follow.
        // We do this in code rather than using a rule so that the heuristic
        // resynch continues to function. For example, one of the suffix characters
        // could be a typo in the middle of a word.
        if ((int32_t)utext_getNativeIndex(text) < rangeEnd && cuWordLength > 0) {
            if (words[wordsFound%THAI_LOOKAHEAD].candidates(text, fDictionary, rangeEnd) <= 0
                && fSuffixSet.contains(uc = utext_current32(text))) {
                if (uc == THAI_PAIYANNOI) {
                    if (!fSuffixSet.contains(utext_previous32(text))) {
                        // Skip over previous end and PAIYANNOI
                        utext_next32(text);
                        int32_t paiyannoiIndex = (int32_t)utext_getNativeIndex(text);
                        utext_next32(text);
                        cuWordLength += (int32_t)utext_getNativeIndex(text) - paiyannoiIndex;    // Add PAIYANNOI to word
                        uc = utext_current32(text);     // Fetch next character
                    }
                    else {
                        // Restore prior position
                        utext_next32(text);
                    }
                }
                if (uc == THAI_MAIYAMOK) {
                    if (utext_previous32(text) != THAI_MAIYAMOK) {
                        // Skip over previous end and MAIYAMOK
                        utext_next32(text);
                        int32_t maiyamokIndex = (int32_t)utext_getNativeIndex(text);
                        utext_next32(text);
                        cuWordLength += (int32_t)utext_getNativeIndex(text) - maiyamokIndex;    // Add MAIYAMOK to word
                    }
                    else {
                        // Restore prior position
                        utext_next32(text);
                    }
                }
            }
            else {
                utext_setNativeIndex(text, current+cuWordLength);
            }
        }

        // Did we find a word on this iteration? If so, push it on the break stack
        if (cuWordLength > 0) {
            foundBreaks.push((current+cuWordLength), status);
        }
    }

    // Don't return a break for the end of the dictionary range if there is one there.
    if (foundBreaks.peeki() >= rangeEnd) {
        (void) foundBreaks.popi();
        wordsFound -= 1;
    }

    return wordsFound;
}